

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

Vertex * __thiscall
btConvexHullInternal::Pool<btConvexHullInternal::Vertex>::newObject
          (Pool<btConvexHullInternal::Vertex> *this)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *in_RSI;
  undefined8 *in_RDI;
  PoolArray<btConvexHullInternal::Vertex> *p;
  Vertex *o;
  int in_stack_ffffffffffffffcc;
  PoolArray<btConvexHullInternal::Vertex> *in_stack_ffffffffffffffd0;
  PoolArray<btConvexHullInternal::Vertex> *local_18;
  Vertex *local_10;
  
  local_10 = (Vertex *)in_RDI[2];
  if (local_10 == (Vertex *)0x0) {
    local_18 = (PoolArray<btConvexHullInternal::Vertex> *)in_RDI[1];
    if (local_18 == (PoolArray<btConvexHullInternal::Vertex> *)0x0) {
      local_18 = (PoolArray<btConvexHullInternal::Vertex> *)
                 btAlignedAllocInternal((size_t)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc)
      ;
      in_RSI = (EVP_PKEY_CTX *)(ulong)*(uint *)(in_RDI + 3);
      PoolArray<btConvexHullInternal::Vertex>::PoolArray
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      local_18->next = (PoolArray<btConvexHullInternal::Vertex> *)*in_RDI;
      *in_RDI = local_18;
    }
    else {
      in_RDI[1] = local_18->next;
    }
    iVar1 = PoolArray<btConvexHullInternal::Vertex>::init(local_18,in_RSI);
    local_10 = (Vertex *)CONCAT44(extraout_var,iVar1);
  }
  in_RDI[2] = local_10->next;
  Vertex::Vertex(local_10);
  return local_10;
}

Assistant:

T* newObject()
				{
					T* o = freeObjects;
					if (!o)
					{
						PoolArray<T>* p = nextArray;
						if (p)
						{
							nextArray = p->next;
						}
						else
						{
							p = new(btAlignedAlloc(sizeof(PoolArray<T>), 16)) PoolArray<T>(arraySize);
							p->next = arrays;
							arrays = p;
						}
						o = p->init();
					}
					freeObjects = o->next;
					return new(o) T();
				}